

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_random.c
# Opt level: O0

void la_arc4random_buf(void *_buf,size_t n)

{
  uint8_t uVar1;
  uint8_t *buf;
  size_t n_local;
  void *_buf_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&arc4random_mtx);
  arc4_stir_if_needed();
  buf = (uint8_t *)n;
  while (buf != (uint8_t *)0x0) {
    arc4_count = arc4_count + -1;
    if (arc4_count < 1) {
      arc4_stir();
    }
    uVar1 = arc4_getbyte();
    *(uint8_t *)((long)_buf + (long)(buf + -1)) = uVar1;
    buf = buf + -1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&arc4random_mtx);
  return;
}

Assistant:

static void
la_arc4random_buf(void *_buf, size_t n)
{
	uint8_t *buf = (uint8_t *)_buf;
	_ARC4_LOCK();
	arc4_stir_if_needed();
	while (n--) {
		if (--arc4_count <= 0)
			arc4_stir();
		buf[n] = arc4_getbyte();
	}
	_ARC4_UNLOCK();
}